

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixDelete(sqlite3_vfs *NotUsed,char *zPath,int dirSync)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  int fd;
  int local_1c;
  
  iVar1 = (*aSyscall[0x10].pCurrent)(zPath);
  if (iVar1 == -1) {
    puVar3 = (uint *)__errno_location();
    iVar1 = 0x170a;
    if (*puVar3 != 2) {
      if (zPath == (char *)0x0) {
        zPath = "";
      }
      iVar1 = 0xa0a;
      sqlite3_log(0xa0a,"os_unix.c:%d: (%d) %s(%s) - %s",0xaf72,(ulong)*puVar3,"unlink",zPath,"");
    }
  }
  else {
    iVar1 = 0;
    if ((dirSync & 1U) != 0) {
      iVar2 = (*aSyscall[0x11].pCurrent)(zPath,&local_1c);
      iVar1 = 0;
      if (iVar2 == 0) {
        iVar1 = fsync(local_1c);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          puVar3 = (uint *)__errno_location();
          if (zPath == (char *)0x0) {
            zPath = "";
          }
          iVar1 = 0x50a;
          sqlite3_log(0x50a,"os_unix.c:%d: (%d) %s(%s) - %s",0xaf7c,(ulong)*puVar3,"fsync",zPath,"")
          ;
        }
        robust_close((unixFile *)0x0,local_1c,0xaf7e);
      }
    }
  }
  return iVar1;
}

Assistant:

static int unixDelete(
  sqlite3_vfs *NotUsed,     /* VFS containing this as the xDelete method */
  const char *zPath,        /* Name of file to be deleted */
  int dirSync               /* If true, fsync() directory after deleting file */
){
  int rc = SQLITE_OK;
  UNUSED_PARAMETER(NotUsed);
  SimulateIOError(return SQLITE_IOERR_DELETE);
  if( osUnlink(zPath)==(-1) ){
    if( errno==ENOENT
#if OS_VXWORKS
        || osAccess(zPath,0)!=0
#endif
    ){
      rc = SQLITE_IOERR_DELETE_NOENT;
    }else{
      rc = unixLogError(SQLITE_IOERR_DELETE, "unlink", zPath);
    }
    return rc;
  }
#ifndef SQLITE_DISABLE_DIRSYNC
  if( (dirSync & 1)!=0 ){
    int fd;
    rc = osOpenDirectory(zPath, &fd);
    if( rc==SQLITE_OK ){
      if( full_fsync(fd,0,0) ){
        rc = unixLogError(SQLITE_IOERR_DIR_FSYNC, "fsync", zPath);
      }
      robust_close(0, fd, __LINE__);
    }else{
      assert( rc==SQLITE_CANTOPEN );
      rc = SQLITE_OK;
    }
  }
#endif
  return rc;
}